

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O1

void __thiscall
iDynTree::XMLElement::XMLElementPimpl::XMLElementPimpl
          (XMLElementPimpl *this,XMLParserState *parserState,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *attributes)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>_>_>
  local_38;
  
  (this->f_childParsed).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_childParsed)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_childParsed).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_childParsed).super__Function_base._M_functor + 8) = 0;
  (this->f_exitScope).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_exitScope)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_exitScope).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_exitScope).super__Function_base._M_functor + 8) = 0;
  (this->f_attribute).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_attribute)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_attribute).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_attribute).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_charactersStream);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  local_38._M_h = (__hashtable_alloc *)&this->m_attributes;
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attributes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attributes)._M_h._M_bucket_count = (attributes->_M_h)._M_bucket_count;
  (this->m_attributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_attributes)._M_h._M_element_count = (attributes->_M_h)._M_element_count;
  uVar3 = *(undefined4 *)&(attributes->_M_h)._M_rehash_policy.field_0x4;
  sVar2 = (attributes->_M_h)._M_rehash_policy._M_next_resize;
  (this->m_attributes)._M_h._M_rehash_policy._M_max_load_factor =
       (attributes->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->m_attributes)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->m_attributes)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->m_attributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,&attributes->_M_h,&local_38);
  this->m_parserState = parserState;
  return;
}

Assistant:

explicit XMLElementPimpl(XMLParserState& parserState,
                                 const std::string& name,
                                 const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>>& attributes)
                                 : m_name(name), m_attributes(attributes), m_parserState(parserState) {}